

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

SelectionSet * __thiscall OpenMD::SelectionEvaluator::allInstruction(SelectionEvaluator *this)

{
  SelectionSet *in_RDI;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  SelectionSet *ss;
  Molecule *in_stack_fffffffffffffe68;
  reference in_stack_fffffffffffffe70;
  reference in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  SelectionEvaluator *in_stack_fffffffffffffea8;
  Inversion *local_88;
  Torsion *local_80;
  Bend *local_78;
  Bond *local_70;
  RigidBody *local_68;
  Atom *local_60;
  Molecule *local_58;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_50;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_38;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  createSelectionSets(in_stack_fffffffffffffea8);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_50);
  local_58 = SimInfo::beginMolecule
                       ((SimInfo *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                        (MoleculeIterator *)in_stack_fffffffffffffe88);
  while (local_58 != (Molecule *)0x0) {
    local_60 = Molecule::beginAtom((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                   (iterator *)in_stack_fffffffffffffe88);
    while (local_60 != (Atom *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&in_RDI->bitsets_,0);
      StuntDouble::getGlobalIndex(&local_60->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_60 = Molecule::nextAtom((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (iterator *)in_stack_fffffffffffffe88);
    }
    local_68 = Molecule::beginRigidBody
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (iterator *)in_stack_fffffffffffffe88);
    while (local_68 != (RigidBody *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&in_RDI->bitsets_,0);
      StuntDouble::getGlobalIndex(&local_68->super_StuntDouble);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_68 = Molecule::nextRigidBody
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (iterator *)in_stack_fffffffffffffe88);
    }
    local_70 = Molecule::beginBond((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                   (iterator *)in_stack_fffffffffffffe88);
    while (local_70 != (Bond *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&in_RDI->bitsets_,1);
      ShortRangeInteraction::getGlobalIndex(&local_70->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_70 = Molecule::nextBond((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (iterator *)in_stack_fffffffffffffe88);
    }
    local_78 = Molecule::beginBend((Molecule *)
                                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                   (iterator *)in_stack_fffffffffffffe88);
    while (local_78 != (Bend *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&in_RDI->bitsets_,2);
      ShortRangeInteraction::getGlobalIndex(&local_78->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_78 = Molecule::nextBend((Molecule *)
                                    CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                    (iterator *)in_stack_fffffffffffffe88);
    }
    local_80 = Molecule::beginTorsion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (iterator *)in_stack_fffffffffffffe88);
    while (local_80 != (Torsion *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&in_RDI->bitsets_,3);
      ShortRangeInteraction::getGlobalIndex(&local_80->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_80 = Molecule::nextTorsion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (iterator *)in_stack_fffffffffffffe88);
    }
    local_88 = Molecule::beginInversion
                         ((Molecule *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                          (iterator *)in_stack_fffffffffffffe88);
    while (local_88 != (Inversion *)0x0) {
      in_stack_fffffffffffffe88 =
           std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                     (&in_RDI->bitsets_,4);
      in_stack_fffffffffffffe94 =
           ShortRangeInteraction::getGlobalIndex(&local_88->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
      local_88 = Molecule::nextInversion
                           ((Molecule *)
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (iterator *)in_stack_fffffffffffffe88);
    }
    in_stack_fffffffffffffe70 =
         std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                   (&in_RDI->bitsets_,5);
    Molecule::getGlobalIndex(local_58);
    OpenMDBitSet::setBitOn(in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
    in_stack_fffffffffffffe68 =
         SimInfo::nextMolecule
                   ((SimInfo *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                    (MoleculeIterator *)in_stack_fffffffffffffe88);
    local_58 = in_stack_fffffffffffffe68;
  }
  return in_RDI;
}

Assistant:

SelectionSet SelectionEvaluator::allInstruction() {
    SelectionSet ss = createSelectionSets();

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    // Doing the loop insures that we're actually on this processor.

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }
      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());
    }

    return ss;
  }